

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse_class(Parser *this)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  size_type *psVar6;
  bool bVar7;
  string local_90;
  string local_70;
  string local_50;
  
  query_tokenizer(this);
  poVar4 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<class>",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"IDENTIFIER","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"class keyword","");
  check_token_type_x_after_y(this,&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  poVar4 = (ostream *)this->out_file;
  __rhs = &this->cur_token;
  std::operator+(&local_70,"\t<identifier>",__rhs);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->tokenizer->type_map,__rhs);
  *pmVar5 = 1;
  std::__cxx11::string::_M_assign((string *)&this->class_name);
  query_tokenizer(this);
  Tokenizer::get_current_token_abi_cxx11_(&local_90,this->tokenizer);
  iVar2 = std::__cxx11::string::compare((char *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == 0) {
    poVar4 = (ostream *)this->out_file;
    std::operator+(&local_70,"\t<symbol>",__rhs);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar3[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_90._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    query_tokenizer(this);
  }
  else {
    Tokenizer::get_current_token_abi_cxx11_(&local_70,this->tokenizer);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1341b3);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar3[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_90._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  while( true ) {
    Tokenizer::get_current_token_abi_cxx11_(&local_90,this->tokenizer);
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar2 == 0) {
      bVar7 = true;
    }
    else {
      Tokenizer::get_current_token_abi_cxx11_(&local_70,this->tokenizer);
      iVar2 = std::__cxx11::string::compare((char *)&local_70);
      bVar7 = iVar2 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (!bVar7) break;
    parse_class_var_dec(this);
    query_tokenizer(this);
  }
  while (((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
          (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
         (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0))) {
    std::__cxx11::string::_M_assign((string *)&this->cur_subroutine_type);
    query_tokenizer(this);
    parse_subroutine(this);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"}","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"class definition","");
  check_expected_x_after_y(this,&local_90,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  poVar4 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</class>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  query_tokenizer(this);
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    do {
      std::__cxx11::string::_M_replace
                ((ulong)&this->cur_subroutine_type,0,
                 (char *)(this->cur_subroutine_type)._M_string_length,0x1331d8);
      query_tokenizer(this);
      Symbol_Table::start_subroutine(&this->symbol_table);
      parse_subroutine(this);
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
    } while (iVar2 == 0);
  }
  Symbol_Table::free_class(&this->symbol_table);
  return;
}

Assistant:

void Parser::parse_class() {
    // skip class declaration
    query_tokenizer();

    out_file << "<class>" << std::endl;

    check_token_type_x_after_y("IDENTIFIER", "class keyword");
    out_file << "\t<identifier>" + cur_token + "</identifier>" << std::endl;
    tokenizer.add_type(cur_token);
    class_name = cur_token;
    query_tokenizer();

    if (tokenizer.get_current_token() == "{") {
        out_file << "\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: expected { instead of the token '" +
        tokenizer.get_current_token() <<"'" <<std::endl;
    }

    while(tokenizer.get_current_token() == "static" || tokenizer.get_current_token() == "field"){
        parse_class_var_dec();
        query_tokenizer();
    }

    while (cur_token == "constructor"  || cur_token == "function" || cur_token == "method") {
        cur_subroutine_type = cur_token;
        query_tokenizer();
        parse_subroutine();
    }

    check_expected_x_after_y("}", "class definition");
    out_file << "</class>" << std::endl;
    query_tokenizer();

    while (cur_token == "function") {
        cur_subroutine_type = "function";
        query_tokenizer();
        symbol_table.start_subroutine();
        parse_subroutine();
    }

    symbol_table.free_class();
}